

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::usdc::USDCReader::Impl::ToAPISchemas
          (expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Impl *this,ListOp<tinyusdz::Token> *arg,bool ignore_unknown,
          string *warn)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pTVar4;
  pointer pTVar5;
  value_type *pvVar6;
  undefined7 in_register_00000009;
  ListOp<tinyusdz::Token> *extraout_RDX;
  ListOp<tinyusdz::Token> *extraout_RDX_00;
  ListOp<tinyusdz::Token> *extraout_RDX_01;
  ListOp<tinyusdz::Token> *extraout_RDX_02;
  ListOp<tinyusdz::Token> *extraout_RDX_03;
  ListOp<tinyusdz::Token> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Token *item;
  const_iterator __begin5;
  optional<tinyusdz::APISchemas::APIName> pv;
  string instanceName;
  APISchemas schemas;
  optional<tinyusdz::APISchemas::APIName> local_b4;
  undefined4 local_ac;
  expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  undefined1 local_50 [8];
  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  local_ac = (undefined4)CONCAT71(in_register_00000009,ignore_unknown);
  local_50._0_4_ = ResetToExplicit;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = warn;
  if (arg->is_explicit == true) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (arg->explicit_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_a8 = __return_storage_ptr__;
    for (__rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (arg->explicit_items).
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
      ToAPISchemas::anon_class_1_0_00000001::operator()
                ((optional<tinyusdz::APISchemas::APIName> *)local_a0,
                 (anon_class_1_0_00000001 *)__rhs,(token *)arg);
      local_b4.has_value_ = (bool)local_a0[0];
      if (local_a0[0] == ConnectableAPI) {
        local_b4.contained = (storage_t<tinyusdz::APISchemas::APIName>)local_a0._4_4_;
        ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)local_a0);
        pvVar6 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value(&local_b4);
        ::std::
        pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_a0,pvVar6,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
        ::std::
        vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
        ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                  ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                    *)&local_48,
                   (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_a0);
      }
      else {
        if ((char)local_ac == '\0') goto LAB_0014b28a;
        ::std::operator+(&local_78,"Ignored unknown or unsupported API schema: ",__rhs);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,&local_78,"\n");
        ::std::__cxx11::string::append((string *)local_58);
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      arg = extraout_RDX;
    }
LAB_0014ae26:
    local_50._0_4_ = ResetToExplicit;
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (arg->explicit_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (arg->explicit_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (arg->added_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (arg->added_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pbVar1 != __rhs) {
      if ((((pbVar2 != pbVar3) ||
           ((arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start)) ||
          ((arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)))) {
LAB_0014b17e:
        local_a0 = (undefined1  [8])0x2dffc9;
LAB_0014b185:
        nonstd::expected_lite::
        expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<const_char_*,_0>
                  (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_a0);
        goto LAB_0014b2fd;
      }
      local_a8 = __return_storage_ptr__;
      for (; __rhs != pbVar1; __rhs = __rhs + 1) {
        ToAPISchemas::anon_class_1_0_00000001::operator()
                  ((optional<tinyusdz::APISchemas::APIName> *)local_a0,
                   (anon_class_1_0_00000001 *)__rhs,(token *)arg);
        local_b4.has_value_ = (bool)local_a0[0];
        if (local_a0[0] == ConnectableAPI) {
          local_b4.contained = (storage_t<tinyusdz::APISchemas::APIName>)local_a0._4_4_;
          ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)local_a0);
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value(&local_b4);
          ::std::
          pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0,pvVar6,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78)
          ;
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&local_48,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0);
        }
        else {
          if ((char)local_ac == '\0') goto LAB_0014b28a;
          ::std::operator+(&local_78,"Ignored unknown or unsupported API schema: ",__rhs);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,&local_78,"\n");
          ::std::__cxx11::string::append((string *)local_58);
        }
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        arg = extraout_RDX_00;
      }
      goto LAB_0014ae26;
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (arg->appended_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (arg->appended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar2 == pbVar3) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (arg->deleted_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (arg->deleted_items).
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pbVar1 == __rhs) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (arg->prepended_items).
                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                super__Vector_impl_data._M_start;
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (arg->prepended_items).
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pbVar3 == pbVar2) {
          pTVar4 = (arg->ordered_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar5 = (arg->ordered_items).
                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pbVar1 == __rhs) {
            if (pTVar5 == pTVar4) {
              local_a0 = (undefined1  [8])0x2e0034;
            }
            else {
              local_a0 = (undefined1  [8])0x2e0018;
            }
            goto LAB_0014b185;
          }
          if (pTVar5 != pTVar4) goto LAB_0014b17e;
          local_a8 = __return_storage_ptr__;
          for (; __rhs != pbVar1; __rhs = __rhs + 1) {
            ToAPISchemas::anon_class_1_0_00000001::operator()
                      ((optional<tinyusdz::APISchemas::APIName> *)local_a0,
                       (anon_class_1_0_00000001 *)__rhs,(token *)arg);
            local_b4.has_value_ = (bool)local_a0[0];
            if (local_a0[0] == ConnectableAPI) {
              local_b4.contained = (storage_t<tinyusdz::APISchemas::APIName>)local_a0._4_4_;
              ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)local_a0);
              pvVar6 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value
                                 (&local_b4);
              ::std::
              pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_a0,pvVar6,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
              ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                        ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                          *)&local_48,
                         (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_a0);
            }
            else {
              if ((char)local_ac == '\0') goto LAB_0014b28a;
              ::std::operator+(&local_78,"Ignored unknown or unsupported API schema: ",__rhs);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0,&local_78,"\n");
              ::std::__cxx11::string::append((string *)local_58);
            }
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            arg = extraout_RDX_04;
          }
          local_50._0_4_ = Prepend;
        }
        else {
          if ((pbVar1 != __rhs) ||
             ((arg->ordered_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (arg->ordered_items).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start)) goto LAB_0014b17e;
          local_a8 = __return_storage_ptr__;
          for (__rhs = pbVar2; __rhs != pbVar3; __rhs = __rhs + 1) {
            ToAPISchemas::anon_class_1_0_00000001::operator()
                      ((optional<tinyusdz::APISchemas::APIName> *)local_a0,
                       (anon_class_1_0_00000001 *)__rhs,(token *)arg);
            local_b4.has_value_ = (bool)local_a0[0];
            if (local_a0[0] == ConnectableAPI) {
              local_b4.contained = (storage_t<tinyusdz::APISchemas::APIName>)local_a0._4_4_;
              ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)local_a0);
              pvVar6 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value
                                 (&local_b4);
              ::std::
              pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_a0,pvVar6,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
              ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                        ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                          *)&local_48,
                         (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_a0);
            }
            else {
              if ((char)local_ac == '\0') goto LAB_0014b28a;
              ::std::operator+(&local_78,"Ignored unknown or unsupported API schema: ",__rhs);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0,&local_78,"\n");
              ::std::__cxx11::string::append((string *)local_58);
            }
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            arg = extraout_RDX_03;
          }
          local_50._0_4_ = Delete;
        }
      }
      else {
        if (((pbVar3 != pbVar2) ||
            ((arg->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (arg->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start)) ||
           ((arg->ordered_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (arg->ordered_items).
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start)) goto LAB_0014b17e;
        local_a8 = __return_storage_ptr__;
        for (; __rhs != pbVar1; __rhs = __rhs + 1) {
          ToAPISchemas::anon_class_1_0_00000001::operator()
                    ((optional<tinyusdz::APISchemas::APIName> *)local_a0,
                     (anon_class_1_0_00000001 *)__rhs,(token *)arg);
          local_b4.has_value_ = (bool)local_a0[0];
          if (local_a0[0] == ConnectableAPI) {
            local_b4.contained = (storage_t<tinyusdz::APISchemas::APIName>)local_a0._4_4_;
            ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)local_a0);
            pvVar6 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value
                               (&local_b4);
            ::std::
            pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_a0,pvVar6,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_78);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)&local_48,
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_a0);
          }
          else {
            if ((char)local_ac == '\0') goto LAB_0014b28a;
            ::std::operator+(&local_78,"Ignored unknown or unsupported API schema: ",__rhs);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0,&local_78,"\n");
            ::std::__cxx11::string::append((string *)local_58);
          }
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          arg = extraout_RDX_02;
        }
        local_50._0_4_ = Append;
      }
    }
    else {
      if (((pbVar1 != __rhs) ||
          ((arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->deleted_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->prepended_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (arg->ordered_items).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start)))) goto LAB_0014b17e;
      local_a8 = __return_storage_ptr__;
      for (__rhs = pbVar3; __rhs != pbVar2; __rhs = __rhs + 1) {
        ToAPISchemas::anon_class_1_0_00000001::operator()
                  ((optional<tinyusdz::APISchemas::APIName> *)local_a0,
                   (anon_class_1_0_00000001 *)__rhs,(token *)arg);
        local_b4.has_value_ = (bool)local_a0[0];
        if (local_a0[0] == ConnectableAPI) {
          local_b4.contained = (storage_t<tinyusdz::APISchemas::APIName>)local_a0._4_4_;
          ::std::__cxx11::string::string((string *)&local_78,"",(allocator *)local_a0);
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::APISchemas::APIName>::value(&local_b4);
          ::std::
          pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<tinyusdz::APISchemas::APIName_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0,pvVar6,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78)
          ;
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&local_48,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_a0);
        }
        else {
          if ((char)local_ac == '\0') goto LAB_0014b28a;
          ::std::operator+(&local_78,"Ignored unknown or unsupported API schema: ",__rhs);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,&local_78,"\n");
          ::std::__cxx11::string::append((string *)local_58);
        }
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        arg = extraout_RDX_01;
      }
      local_50._0_4_ = Add;
    }
  }
  __return_storage_ptr__ = local_a8;
  nonstd::expected_lite::
  expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<tinyusdz::APISchemas,_0>(local_a8,(APISchemas *)local_50);
LAB_0014b2fd:
  ::std::
  vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
LAB_0014b28a:
  ::std::operator+(&local_78,"Invalid or Unsupported API schema: ",__rhs);
  __return_storage_ptr__ = local_a8;
  local_a0 = (undefined1  [8])local_90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    local_90._8_8_ = local_78.field_2._8_8_;
  }
  else {
    local_a0 = (undefined1  [8])local_78._M_dataplus._M_p;
  }
  local_98._M_p = (pointer)local_78._M_string_length;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  nonstd::expected_lite::
  expected<tinyusdz::APISchemas,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_a8,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_a0);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  goto LAB_0014b2fd;
}

Assistant:

nonstd::expected<APISchemas, std::string> USDCReader::Impl::ToAPISchemas(
    const ListOp<value::token> &arg, bool ignore_unknown, std::string &warn) {
  APISchemas schemas;

  auto SchemaHandler =
      [](const value::token &tok) -> nonstd::optional<APISchemas::APIName> {
    if (tok.str() == "MaterialBindingAPI") {
      return APISchemas::APIName::MaterialBindingAPI;
    } else if (tok.str() == "NodeDefAPI") {
      return APISchemas::APIName::NodeDefAPI;
    } else if (tok.str() == "CoordSysAPI") {
      return APISchemas::APIName::CoordSysAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "CollectionAPI") {
      return APISchemas::APIName::CollectionAPI;
    } else if (tok.str() == "SkelBindingAPI") {
      return APISchemas::APIName::SkelBindingAPI;
    } else if (tok.str() == "VisibilityAPI") {
      return APISchemas::APIName::VisibilityAPI;
    } else if (tok.str() == "GeomModelAPI") {
      return APISchemas::APIName::GeomModelAPI;
    } else if (tok.str() == "MotionAPI") {
      return APISchemas::APIName::MotionAPI;
    } else if (tok.str() == "PrimvarsAPI") {
      return APISchemas::APIName::PrimvarsAPI;
    } else if (tok.str() == "XformCommonAPI") {
      return APISchemas::APIName::XformCommonAPI;
    } else if (tok.str() == "ListAPI") {
      return APISchemas::APIName::ListAPI;
    } else if (tok.str() == "LightListAPI") {
      return APISchemas::APIName::LightListAPI;
    } else if (tok.str() == "LightAPI") {
      return APISchemas::APIName::LightAPI;
    } else if (tok.str() == "MeshLightAPI") {
      return APISchemas::APIName::MeshLightAPI;
    } else if (tok.str() == "VolumeLightAPI") {
      return APISchemas::APIName::VolumeLightAPI;
    } else if (tok.str() == "ConnectableAPI") {
      return APISchemas::APIName::ConnectableAPI;
    } else if (tok.str() == "ShadowAPI") {
      return APISchemas::APIName::ShadowAPI;
    } else if (tok.str() == "ShapingAPI") {
      return APISchemas::APIName::ShapingAPI;
    } else if (tok.str() == "Preliminary_AnchoringAPI") {
      return APISchemas::APIName::Preliminary_AnchoringAPI;
    } else if (tok.str() == "Preliminary_PhysicsColliderAPI") {
      return APISchemas::APIName::Preliminary_PhysicsColliderAPI;
    } else if (tok.str() == "Preliminary_PhysicsMaterialAPI") {
      return APISchemas::APIName::Preliminary_PhysicsMaterialAPI;
    } else if (tok.str() == "Preliminary_PhysicsRigidBodyAPI") {
      return APISchemas::APIName::Preliminary_PhysicsRigidBodyAPI;
    } else {
      return nonstd::nullopt;
    }
  };

  if (arg.IsExplicit()) {  // fast path
    for (auto &item : arg.GetExplicitItems()) {
      if (auto pv = SchemaHandler(item)) {
        std::string instanceName = "";  // TODO
        schemas.names.push_back({pv.value(), instanceName});
      } else if (ignore_unknown) {
        warn += "Ignored unknown or unsupported API schema: " +
                                       item.str() + "\n";
      } else {
        return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                       item.str());
      }
    }
    schemas.listOpQual = ListEditQual::ResetToExplicit;

  } else {
    // Assume all items have same ListEdit qualifier.
    if (arg.GetExplicitItems().size()) {
      if (arg.GetAddedItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetExplicitItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::ResetToExplicit;

    } else if (arg.GetAddedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAppendedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &item : arg.GetAddedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Add;
    } else if (arg.GetAppendedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetDeletedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetAppendedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Append;
    } else if (arg.GetDeletedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetPrependedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetDeletedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Delete;
    } else if (arg.GetPrependedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetOrderedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }
      for (auto &&item : arg.GetPrependedItems()) {
        if (auto pv = SchemaHandler(item)) {
          std::string instanceName = "";  // TODO
          schemas.names.push_back({pv.value(), instanceName});
        } else if (ignore_unknown) {
          warn += "Ignored unknown or unsupported API schema: " +
                                         item.str() + "\n";
        } else {
          return nonstd::make_unexpected("Invalid or Unsupported API schema: " +
                                         item.str());
        }
      }
      schemas.listOpQual = ListEditQual::Prepend;
    } else if (arg.GetOrderedItems().size()) {
      if (arg.GetExplicitItems().size() || arg.GetAddedItems().size() ||
          arg.GetAppendedItems().size() || arg.GetDeletedItems().size() ||
          arg.GetPrependedItems().size()) {
        return nonstd::make_unexpected(
            "Currently TinyUSDZ does not support ListOp with different "
            "ListEdit qualifiers.");
      }

      // schemas.qual = ListEditQual::Order;
      return nonstd::make_unexpected("TODO: Ordered ListOp items.");
    } else {
      // ??? This should not happend.
      return nonstd::make_unexpected("Internal error: ListOp conversion.");
    }
  }

  return std::move(schemas);
}